

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O0

void __thiscall KeyValueFile::errorParam(KeyValueFile *this,char *msg,char *key_name)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long *in_RDI;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  code *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  if (*in_RDI != 0) {
    local_18 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(local_18,(char *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    pcVar2 = (code *)*in_RDI;
    uVar1 = std::__cxx11::string::c_str();
    (*pcVar2)(uVar1);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void errorParam(const char * msg, const char * key_name) const
  {
    if (printErrorFunc)
    {
      std::string err = std::string("ERROR: ") + msg + ", at file '" + fileName +  "', key '" + std::string(key_name) + "'\n";
      printErrorFunc(err.c_str());
    }
  }